

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract.h
# Opt level: O0

void __thiscall
ContractFrameProtector::ContractFrameProtector(ContractFrameProtector *this,char *name)

{
  ContractFrame *this_00;
  ContractFrame *frame;
  char *name_local;
  ContractFrameProtector *this_local;
  
  if (g_contract_frames == (ContractFrame *)0x0) {
    __assert_fail("g_contract_frames != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/contract.h"
                  ,0x49,"ContractFrameProtector::ContractFrameProtector(const char *)");
  }
  if (g_contract_current_frame != (ContractFrame *)0x0) {
    this_00 = (ContractFrame *)operator_new(0x18);
    ContractFrame::ContractFrame(this_00,name,g_contract_current_frame);
    g_contract_current_frame = this_00;
    this->protected_frame = this_00;
    return;
  }
  __assert_fail("g_contract_current_frame != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/contract.h"
                ,0x4a,"ContractFrameProtector::ContractFrameProtector(const char *)");
}

Assistant:

ContractFrameProtector(const char *name) {
    assert(g_contract_frames != nullptr);
    assert(g_contract_current_frame != nullptr);
    ContractFrame *frame = new ContractFrame(name, g_contract_current_frame);
    g_contract_current_frame = frame;
    protected_frame = frame;
  }